

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int __thiscall google::protobuf::internal::ExtensionSet::Extension::GetSize(Extension *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Extension *local_18;
  Extension *this_local;
  
  local_51 = 0;
  local_18 = this;
  if ((this->is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x706);
    local_51 = 1;
    pLVar2 = LogMessage::operator<<(&local_50,"CHECK failed: is_repeated: ");
    LogFinisher::operator=(local_65,pLVar2);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  CVar1 = anon_unknown_22::cpp_type(this->type);
  switch(CVar1) {
  case CPPTYPE_INT32:
    this_local._4_4_ = RepeatedField<int>::size((this->field_0).repeated_int32_t_value);
    break;
  case CPPTYPE_INT64:
    this_local._4_4_ = RepeatedField<long>::size((this->field_0).repeated_int64_t_value);
    break;
  case CPPTYPE_UINT32:
    this_local._4_4_ = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_t_value);
    break;
  case CPPTYPE_UINT64:
    this_local._4_4_ = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_t_value);
    break;
  case CPPTYPE_DOUBLE:
    this_local._4_4_ = RepeatedField<double>::size((this->field_0).repeated_double_value);
    break;
  case CPPTYPE_FLOAT:
    this_local._4_4_ = RepeatedField<float>::size((this->field_0).repeated_float_value);
    break;
  case CPPTYPE_BOOL:
    this_local._4_4_ = RepeatedField<bool>::size((this->field_0).repeated_bool_value);
    break;
  case CPPTYPE_ENUM:
    this_local._4_4_ = RepeatedField<int>::size((this->field_0).repeated_int32_t_value);
    break;
  case CPPTYPE_STRING:
    this_local._4_4_ =
         RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::size((this->field_0).repeated_string_value);
    break;
  case CPPTYPE_MESSAGE:
    this_local._4_4_ =
         RepeatedPtrField<google::protobuf::MessageLite>::size
                   ((this->field_0).repeated_message_value);
    break;
  default:
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x719);
    pLVar2 = LogMessage::operator<<(&local_a0,"Can\'t get here.");
    LogFinisher::operator=(&local_a1,pLVar2);
    LogMessage::~LogMessage(&local_a0);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ExtensionSet::Extension::GetSize() const {
  GOOGLE_DCHECK(is_repeated);
  switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    return repeated_##LOWERCASE##_value->size()

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
    HANDLE_TYPE(STRING, string);
    HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return 0;
}